

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# party.cpp
# Opt level: O2

void __thiscall Party::Msg(Party *this,Character *from,string *message,bool echo)

{
  World *pWVar1;
  Character *this_00;
  int iVar2;
  int iVar3;
  mapped_type *this_01;
  undefined7 in_register_00000009;
  pointer ppCVar4;
  allocator<char> local_176;
  allocator<char> local_175;
  undefined4 local_174;
  string *local_170;
  pointer local_168;
  PacketBuilder builder;
  key_type local_130;
  string local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_174 = (undefined4)CONCAT71(in_register_00000009,echo);
  pWVar1 = this->world;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"ChatMaxWidth",&local_175)
  ;
  this_01 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar1->config,&local_130);
  iVar2 = util::variant::GetInt(this_01);
  (*(from->super_Command_Source)._vptr_Command_Source[2])(&local_f0,from);
  util::ucfirst(&local_d0,&local_f0);
  std::operator+(&local_b0,&local_d0,"  ");
  iVar3 = util::text_width(&local_b0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"...",&local_176);
  util::text_cap((string *)&builder,message,iVar2 - iVar3,&local_110);
  std::__cxx11::string::operator=((string *)message,(string *)&builder);
  std::__cxx11::string::~string((string *)&builder);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_130);
  PacketBuilder::PacketBuilder(&builder,PACKET_TALK,PACKET_OPEN,message->_M_string_length + 2);
  iVar2 = Character::PlayerID(from);
  PacketBuilder::AddShort(&builder,iVar2);
  PacketBuilder::AddString(&builder,message);
  local_168 = (this->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_170 = message;
  for (ppCVar4 = (this->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppCVar4 != local_168;
      ppCVar4 = ppCVar4 + 1) {
    this_00 = *ppCVar4;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"\'",(allocator<char> *)&local_130);
    (*(from->super_Command_Source)._vptr_Command_Source[2])(&local_70,from);
    std::__cxx11::string::string((string *)&local_90,(string *)local_170);
    Character::AddChatLog(this_00,&local_50,&local_70,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    if (this_00 != from || (char)local_174 != '\0') {
      Character::Send(this_00,&builder);
    }
  }
  PacketBuilder::~PacketBuilder(&builder);
  return;
}

Assistant:

void Party::Msg(Character *from, std::string message, bool echo)
{
	message = util::text_cap(message, static_cast<int>(this->world->config["ChatMaxWidth"]) - util::text_width(util::ucfirst(from->SourceName()) + "  "));

	PacketBuilder builder(PACKET_TALK, PACKET_OPEN, 2 + message.length());

	builder.AddShort(from->PlayerID());
	builder.AddString(message);

	UTIL_FOREACH(this->members, member)
	{
		member->AddChatLog("'", from->SourceName(), message);

		if (!echo && member == from)
			continue;

		member->Send(builder);
	}
}